

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O2

void __thiscall CMU462::PathTracer::clear(PathTracer *this)

{
  BVHAccel *this_00;
  
  if (this->state == READY) {
    this_00 = this->bvh;
    if (this_00 != (BVHAccel *)0x0) {
      StaticScene::BVHAccel::~BVHAccel(this_00);
    }
    operator_delete(this_00);
    this->bvh = (BVHAccel *)0x0;
    this->scene = (Scene *)0x0;
    this->camera = (Camera *)0x0;
    std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>::
    pop_back(&(this->selectionHistory).c);
    HDRImageBuffer::resize(&this->sampleBuffer,0,0);
    ImageBuffer::resize(&this->frameBuffer,0,0);
    this->state = INIT;
  }
  return;
}

Assistant:

void PathTracer::clear() {
  if (state != READY) return;
  delete bvh;
  bvh = NULL;
  scene = NULL;
  camera = NULL;
  selectionHistory.pop();
  sampleBuffer.resize(0, 0);
  frameBuffer.resize(0, 0);
  state = INIT;
}